

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O2

void restore_monsters(void)

{
  wchar_t idx;
  wchar_t wVar1;
  monster *mon;
  int iVar2;
  long lVar3;
  
  iVar2 = turn - cave->turn;
  idx = cave_monster_max(cave);
  while (L'\x01' < idx) {
    idx = idx + L'\xffffffff';
    mon = cave_monster(cave,idx);
    regen_monster(mon,iVar2 / 100);
    wVar1 = turn_energy((uint)mon->mspeed);
    wVar1 = (wVar1 * iVar2) / (int)(uint)z_info->move_energy;
    if (L'\0' < wVar1) {
      for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
        if (mon->m_timed[lVar3] != 0) {
          mon_dec_timed(mon,(wchar_t)lVar3,wVar1,L'\0');
        }
      }
    }
  }
  return;
}

Assistant:

void restore_monsters(void)
{
	int i;
	struct monster *mon;

	/* Get the number of turns that have passed */
	int num_turns = turn - cave->turn;

	/* Process the monsters (backwards) */
	for (i = cave_monster_max(cave) - 1; i >= 1; i--) {
		int status, status_red;

		/* Access the monster */
		mon = cave_monster(cave, i);

		/* Regenerate */
		regen_monster(mon, num_turns / 100);

		/* Handle timed effects */
		status_red = num_turns * turn_energy(mon->mspeed) / z_info->move_energy;
		if (status_red > 0) {
			for (status = 0; status < MON_TMD_MAX; status++) {
				if (mon->m_timed[status]) {
					mon_dec_timed(mon, status, status_red, 0);
				}
			}
		}
	}
}